

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedCollator::writeIdenticalLevel
          (RuleBasedCollator *this,UChar *s,UChar *limit,SortKeyByteSink *sink,UErrorCode *errorCode
          )

{
  UChar32 prev;
  UChar *src;
  int32_t destLengthEstimate;
  UnicodeString nfd;
  UnicodeString local_70;
  
  prev = 0;
  src = Normalizer2Impl::decompose(this->data->nfcImpl,s,limit,(ReorderingBuffer *)0x0,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    SortKeyByteSink::Append(sink,1);
    if ((long)src - (long)s != 0) {
      prev = u_writeIdenticalLevelRun_63
                       (0,s,(int32_t)((ulong)((long)src - (long)s) >> 1),&sink->super_ByteSink);
    }
    if (limit == (UChar *)0x0) {
      destLengthEstimate = -1;
      if (*src == L'\0') {
        return;
      }
    }
    else {
      if (src == limit) {
        return;
      }
      destLengthEstimate = (int32_t)((ulong)((long)limit - (long)src) >> 1);
    }
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    Normalizer2Impl::decompose(this->data->nfcImpl,src,limit,&local_70,destLengthEstimate,errorCode)
    ;
    if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
      }
    }
    else {
      local_70.fUnion.fFields.fArray = (char16_t *)0x0;
    }
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    u_writeIdenticalLevelRun_63
              (prev,local_70.fUnion.fFields.fArray,local_70.fUnion.fFields.fLength,
               &sink->super_ByteSink);
    UnicodeString::~UnicodeString(&local_70);
  }
  return;
}

Assistant:

void
RuleBasedCollator::writeIdenticalLevel(const UChar *s, const UChar *limit,
                                       SortKeyByteSink &sink, UErrorCode &errorCode) const {
    // NFD quick check
    const UChar *nfdQCYesLimit = data->nfcImpl.decompose(s, limit, NULL, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
    UChar32 prev = 0;
    if(nfdQCYesLimit != s) {
        prev = u_writeIdenticalLevelRun(prev, s, (int32_t)(nfdQCYesLimit - s), sink);
    }
    // Is there non-NFD text?
    int32_t destLengthEstimate;
    if(limit != NULL) {
        if(nfdQCYesLimit == limit) { return; }
        destLengthEstimate = (int32_t)(limit - nfdQCYesLimit);
    } else {
        // s is NUL-terminated
        if(*nfdQCYesLimit == 0) { return; }
        destLengthEstimate = -1;
    }
    UnicodeString nfd;
    data->nfcImpl.decompose(nfdQCYesLimit, limit, nfd, destLengthEstimate, errorCode);
    u_writeIdenticalLevelRun(prev, nfd.getBuffer(), nfd.length(), sink);
}